

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O2

void Res_SimDeriveInfoReplicate(Res_Sim_t *p)

{
  Abc_Obj_t *pAVar1;
  void *pvVar2;
  undefined4 *puVar3;
  int iVar4;
  long lVar5;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < p->pAig->vPos->nSize; i_00 = i_00 + 1) {
    pAVar1 = Abc_NtkPo(p->pAig,i_00);
    pvVar2 = Vec_PtrEntry(p->vPats,pAVar1->Id);
    puVar3 = (undefined4 *)Vec_PtrEntry(p->vOuts,i_00);
    for (iVar4 = 0; iVar4 < p->nPats; iVar4 = iVar4 + 1) {
      for (lVar5 = 0; lVar5 < p->nWords; lVar5 = lVar5 + 1) {
        *puVar3 = *(undefined4 *)((long)pvVar2 + lVar5 * 4);
        puVar3 = puVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void Res_SimDeriveInfoReplicate( Res_Sim_t * p )
{
    unsigned * pInfo, * pInfo2;
    Abc_Obj_t * pObj;
    int i, j, w;
    Abc_NtkForEachPo( p->pAig, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( p->vPats, pObj->Id );
        pInfo2 = (unsigned *)Vec_PtrEntry( p->vOuts, i );
        for ( j = 0; j < p->nPats; j++ )
            for ( w = 0; w < p->nWords; w++ )
                *pInfo2++ = pInfo[w];
    }
}